

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delta_byte_array_decoder.cpp
# Opt level: O2

void __thiscall duckdb::DeltaByteArrayDecoder::InitializePage(DeltaByteArrayDecoder *this)

{
  unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *this_00;
  uint uVar1;
  int iVar2;
  uint uVar3;
  ColumnReader *pCVar4;
  Allocator *allocator;
  data_ptr_t pdVar5;
  data_ptr_t pdVar6;
  __uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_> _Var7;
  type buffer;
  type pVVar8;
  ulong uVar9;
  runtime_error *this_01;
  idx_t len;
  char *__dest;
  void *__src;
  ulong uVar10;
  anon_union_16_2_67f50693_for_value *this_02;
  anon_struct_16_3_d7536bce_for_pointer aVar11;
  idx_t prefix_count;
  unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *local_50;
  __uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_> local_48;
  undefined8 local_40;
  idx_t suffix_count;
  
  if ((this->reader->column_schema->type).physical_type_ == VARCHAR) {
    buffer = shared_ptr<duckdb::ResizeableBuffer,_true>::operator*(&this->reader->block);
    pCVar4 = this->reader;
    allocator = pCVar4->reader->allocator;
    ReadDbpData(allocator,buffer,pCVar4->encoding_buffers,&prefix_count);
    ReadDbpData(allocator,buffer,pCVar4->encoding_buffers + 1,&suffix_count);
    if (prefix_count == suffix_count) {
      this_00 = &this->byte_array_data;
      if (prefix_count == 0) {
        local_40 = 0;
        make_uniq<duckdb::Vector,duckdb::LogicalTypeId_const&,decltype(nullptr)>
                  ((LogicalTypeId *)&local_48,(void **)&LogicalType::VARCHAR);
        _Var7._M_t.super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
        super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl =
             local_48._M_t.
             super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
             super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl;
        local_48._M_t.super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>
        .super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl =
             (tuple<duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>)
             (_Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>)0x0;
        ::std::__uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>::reset
                  ((__uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_> *)this_00,
                   (pointer)_Var7._M_t.
                            super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>
                            .super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl);
        ::std::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>::~unique_ptr
                  ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_> *)&local_48);
      }
      else {
        pdVar5 = pCVar4->encoding_buffers[0].super_ByteBuffer.ptr;
        pdVar6 = pCVar4->encoding_buffers[1].super_ByteBuffer.ptr;
        make_uniq<duckdb::Vector,duckdb::LogicalTypeId_const&,unsigned_long&>
                  ((duckdb *)&local_48,&LogicalType::VARCHAR,&prefix_count);
        _Var7._M_t.super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
        super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl =
             local_48._M_t.
             super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
             super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl;
        local_48._M_t.super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>
        .super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl =
             (tuple<duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>)
             (_Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>)0x0;
        ::std::__uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>::reset
                  ((__uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_> *)this_00,
                   (pointer)_Var7._M_t.
                            super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>
                            .super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl);
        ::std::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>::~unique_ptr
                  ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_> *)&local_48);
        this->byte_array_count = prefix_count;
        this->delta_offset = 0;
        local_50 = this_00;
        pVVar8 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                           (this_00);
        this_02 = (anon_union_16_2_67f50693_for_value *)pVVar8->data;
        for (uVar10 = 0; uVar10 < prefix_count; uVar10 = uVar10 + 1) {
          uVar1 = *(uint *)(pdVar6 + uVar10 * 4);
          iVar2 = *(int *)(pdVar5 + uVar10 * 4);
          ByteBuffer::available(&buffer->super_ByteBuffer,(ulong)uVar1);
          pVVar8 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                             (local_50);
          aVar11 = (anon_struct_16_3_d7536bce_for_pointer)
                   StringVector::EmptyString
                             ((StringVector *)pVVar8,(Vector *)(ulong)(iVar2 + uVar1),len);
          __dest = aVar11.ptr;
          this_02->pointer = aVar11;
          if (aVar11.length < 0xd) {
            __dest = (this_02->pointer).prefix;
          }
          uVar1 = *(uint *)(pdVar5 + uVar10 * 4);
          if ((ulong)uVar1 == 0) {
            uVar9 = 0;
          }
          else {
            if ((uVar10 == 0) ||
               (uVar3 = (((anon_union_16_2_67f50693_for_value *)&this_02[-1].pointer.length)->
                        pointer).length, uVar3 < uVar1)) {
              this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
              ::std::runtime_error::runtime_error
                        (this_01,"DELTA_BYTE_ARRAY - prefix is out of range - corrupt file?");
              goto LAB_01f61096;
            }
            if (uVar3 < 0xd) {
              __src = (void *)((long)this_02 + -0xc);
            }
            else {
              __src = *(void **)((long)this_02 + -8);
            }
            switchD_016b45db::default(__dest,__src,(ulong)uVar1);
            uVar9 = (ulong)*(uint *)(pdVar5 + uVar10 * 4);
          }
          switchD_016b45db::default
                    (__dest + uVar9,(buffer->super_ByteBuffer).ptr,
                     (ulong)*(uint *)(pdVar6 + uVar10 * 4));
          ByteBuffer::inc(&buffer->super_ByteBuffer,(ulong)*(uint *)(pdVar6 + uVar10 * 4));
          string_t::Finalize((string_t *)&this_02->pointer);
          this_02 = this_02 + 1;
        }
      }
      return;
    }
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::runtime_error::runtime_error
              (this_01,"DELTA_BYTE_ARRAY - prefix and suffix counts are different - corrupt file?");
  }
  else {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::runtime_error::runtime_error
              (this_01,"Delta Byte Array encoding is only supported for string/blob data");
  }
LAB_01f61096:
  __cxa_throw(this_01,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void DeltaByteArrayDecoder::InitializePage() {
	if (reader.Type().InternalType() != PhysicalType::VARCHAR) {
		throw std::runtime_error("Delta Byte Array encoding is only supported for string/blob data");
	}
	auto &block = *reader.block;
	auto &allocator = reader.reader.allocator;
	idx_t prefix_count, suffix_count;
	auto &prefix_buffer = reader.encoding_buffers[0];
	auto &suffix_buffer = reader.encoding_buffers[1];
	ReadDbpData(allocator, block, prefix_buffer, prefix_count);
	ReadDbpData(allocator, block, suffix_buffer, suffix_count);
	if (prefix_count != suffix_count) {
		throw std::runtime_error("DELTA_BYTE_ARRAY - prefix and suffix counts are different - corrupt file?");
	}
	if (prefix_count == 0) {
		// no values
		byte_array_data = make_uniq<Vector>(LogicalType::VARCHAR, nullptr);
		return;
	}
	auto prefix_data = reinterpret_cast<uint32_t *>(prefix_buffer.ptr);
	auto suffix_data = reinterpret_cast<uint32_t *>(suffix_buffer.ptr);
	byte_array_data = make_uniq<Vector>(LogicalType::VARCHAR, prefix_count);
	byte_array_count = prefix_count;
	delta_offset = 0;
	auto string_data = FlatVector::GetData<string_t>(*byte_array_data);
	for (idx_t i = 0; i < prefix_count; i++) {
		auto str_len = prefix_data[i] + suffix_data[i];
		block.available(suffix_data[i]);
		string_data[i] = StringVector::EmptyString(*byte_array_data, str_len);
		auto result_data = string_data[i].GetDataWriteable();
		if (prefix_data[i] > 0) {
			if (i == 0 || prefix_data[i] > string_data[i - 1].GetSize()) {
				throw std::runtime_error("DELTA_BYTE_ARRAY - prefix is out of range - corrupt file?");
			}
			memcpy(result_data, string_data[i - 1].GetData(), prefix_data[i]);
		}
		memcpy(result_data + prefix_data[i], block.ptr, suffix_data[i]);
		block.inc(suffix_data[i]);
		string_data[i].Finalize();
	}
}